

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_screens.cpp
# Opt level: O3

void __thiscall QXcbConnection::destroyScreen(QXcbConnection *this,QXcbScreen *screen)

{
  long lVar1;
  long *plVar2;
  QXcbVirtualDesktop *pQVar3;
  QArrayData *pQVar4;
  QPlatformScreen **ppQVar5;
  int *piVar6;
  QDebug QVar7;
  undefined8 this_00;
  QLoggingCategory *pQVar8;
  uint uVar9;
  undefined8 *puVar10;
  long lVar11;
  QTextStream *pQVar12;
  QPlatformScreen *pQVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  undefined1 local_b0 [48];
  QDebug local_80;
  undefined1 local_78 [48];
  QString local_48;
  uint *local_30;
  
  local_30 = *(uint **)(in_FS_OFFSET + 0x28);
  pQVar3 = screen->m_virtualDesktop;
  pQVar4 = &((pQVar3->m_screens).d.d)->super_QArrayData;
  lVar11 = (pQVar3->m_screens).d.size;
  local_78._40_8_ = screen;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,8,0x10);
    }
  }
  this_00 = local_78._40_8_;
  if (lVar11 == 1) {
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_4_ = 0xaaaaaaaa;
    local_78._20_4_ = 0xaaaaaaaa;
    local_78._24_4_ = 0xaaaaaaaa;
    local_78._28_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)local_78._40_8_ + 0x90))();
    QXcbScreen::setOutput((QXcbScreen *)this_00,0,(xcb_randr_get_output_info_reply_t *)0x0);
    pQVar8 = QtPrivateLogging::lcQpaScreen();
    if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_b0._40_8_ = pQVar8->name;
      local_b0._16_4_ = 2;
      local_b0._20_4_ = 0;
      local_b0._24_4_ = 0;
      local_b0._28_8_ = 0;
      local_b0._36_4_ = 0;
      QMessageLogger::debug();
      QVar7.stream = local_80.stream;
      QVar14.m_data = (storage_type *)0xb;
      QVar14.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)QVar7.stream,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      puVar10 = (undefined8 *)CONCAT44(local_78._28_4_,local_78._24_4_);
      if (puVar10 == (undefined8 *)0x0) {
        puVar10 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_80,(ulong)puVar10);
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QVar7.stream = local_80.stream;
      QVar15.m_data = (storage_type *)0x7;
      QVar15.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<((QTextStream *)QVar7.stream,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      *(int *)((QTextStream *)local_80.stream + 0x28) =
           *(int *)((QTextStream *)local_80.stream + 0x28) + 1;
      ::operator<<((Stream *)(local_78 + 8),(QXcbScreen *)local_78);
      QDebug::~QDebug((QDebug *)(local_78 + 8));
      QDebug::~QDebug((QDebug *)local_78);
      QDebug::~QDebug(&local_80);
    }
    piVar6 = (int *)CONCAT44(local_78._20_4_,local_78._16_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78._20_4_,local_78._16_4_),2,0x10);
      }
    }
  }
  else {
    QtPrivate::sequential_erase_one<QList<QXcbScreen*>,QXcbScreen*>
              ((QList<QXcbScreen_*> *)(this + 0x338),(QXcbScreen **)(local_78 + 0x28));
    local_b0._16_4_ = (undefined4)local_78._40_8_;
    local_b0._20_4_ = SUB84(local_78._40_8_,4);
    QtPrivate::sequential_erase_one<QList<QPlatformScreen*>,QPlatformScreen*>
              (&pQVar3->m_screens,(QPlatformScreen **)(local_b0 + 0x10));
    if (*(bool *)(local_78._40_8_ + 0x3c) == true) {
      pQVar4 = &((pQVar3->m_screens).d.d)->super_QArrayData;
      ppQVar5 = (pQVar3->m_screens).d.ptr;
      if (pQVar4 == (QArrayData *)0x0) {
        pQVar13 = *ppQVar5;
      }
      else {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar13 = *ppQVar5;
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,8,0x10);
        }
      }
      pQVar13[0x3c] = (QPlatformScreen)0x1;
      if (*(long *)(this + 0x348) != 0) {
        lVar11 = -8;
        do {
          if (*(long *)(this + 0x348) * -8 + lVar11 == -8) goto LAB_00145675;
          lVar1 = lVar11 + 8;
          plVar2 = (long *)(*(long *)(this + 0x340) + 8 + lVar11);
          lVar11 = lVar1;
        } while ((QPlatformScreen *)*plVar2 != pQVar13);
        uVar9 = (uint)(lVar1 >> 3);
        if (0 < (int)uVar9) {
          QList<QXcbScreen_*>::swapItemsAt
                    ((QList<QXcbScreen_*> *)(this + 0x338),0,(ulong)(uVar9 & 0x7fffffff));
        }
      }
LAB_00145675:
      QWindowSystemInterface::handlePrimaryScreenChanged(pQVar13);
    }
    pQVar8 = QtPrivateLogging::lcQpaScreen();
    if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_b0._40_8_ = pQVar8->name;
      local_b0._16_4_ = 2;
      local_b0._20_4_ = 0;
      local_b0._24_4_ = 0;
      local_b0._28_8_ = 0;
      local_b0._36_4_ = 0;
      QMessageLogger::debug();
      pQVar12 = (QTextStream *)CONCAT44(local_78._20_4_,local_78._16_4_);
      QVar16.m_data = (storage_type *)0x16;
      QVar16.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<(pQVar12,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar12 = (QTextStream *)CONCAT44(local_78._20_4_,local_78._16_4_);
      if (pQVar12[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar12,' ');
        pQVar12 = (QTextStream *)CONCAT44(local_78._20_4_,local_78._16_4_);
      }
      *(int *)(pQVar12 + 0x28) = *(int *)(pQVar12 + 0x28) + 1;
      ::operator<<((Stream *)(local_b0 + 8),(QXcbScreen *)local_b0);
      QDebug::~QDebug((QDebug *)(local_b0 + 8));
      QDebug::~QDebug((QDebug *)local_b0);
      QDebug::~QDebug((QDebug *)(local_78 + 0x10));
    }
    QWindowSystemInterface::handleScreenRemoved((QPlatformScreen *)local_78._40_8_);
  }
  if (*(uint **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbConnection::destroyScreen(QXcbScreen *screen)
{
    QXcbVirtualDesktop *virtualDesktop = screen->virtualDesktop();
    if (virtualDesktop->screens().size() == 1) {
        // If there are no other screens on the same virtual desktop,
        // then transform the physical screen into a fake screen.
        const QString nameWas = screen->name();
        screen->setOutput(XCB_NONE, nullptr);
        qCDebug(lcQpaScreen) << "transformed" << nameWas << "to fake" << screen;
    } else {
        // There is more than one screen on the same virtual desktop, remove the screen
        m_screens.removeOne(screen);
        virtualDesktop->removeScreen(screen);

        // When primary screen is removed, set the new primary screen
        // which belongs to the primary virtual desktop.
        if (screen->isPrimary()) {
            QXcbScreen *newPrimary = static_cast<QXcbScreen *>(virtualDesktop->screens().at(0));
            newPrimary->setPrimary(true);
            const int idx = m_screens.indexOf(newPrimary);
            if (idx > 0)
                m_screens.swapItemsAt(0, idx);
            QWindowSystemInterface::handlePrimaryScreenChanged(newPrimary);
        }

        qCDebug(lcQpaScreen) << "destroyScreen: destroy" << screen;
        QWindowSystemInterface::handleScreenRemoved(screen);
    }
}